

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

uint __thiscall QXmlStreamReaderPrivate::filterCarriageReturn(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  uVar2 = peekChar(this);
  if (uVar2 == 0xffffffff) {
    puVar4 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
    *puVar4 = 0xd;
    uVar3 = 0;
  }
  else {
    uVar3 = 10;
    if (uVar2 == 10) {
      lVar1 = (this->putStack).tos;
      if (lVar1 == -1) {
        this->readBufferPos = this->readBufferPos + 1;
      }
      else {
        (this->putStack).tos = lVar1 + -1;
      }
    }
  }
  return uVar3;
}

Assistant:

inline uint QXmlStreamReaderPrivate::filterCarriageReturn()
{
    uint peekc = peekChar();
    if (peekc == '\n') {
        if (putStack.size())
            putStack.pop();
        else
            ++readBufferPos;
        return peekc;
    }
    if (peekc == StreamEOF) {
        putChar('\r');
        return 0;
    }
    return '\n';
}